

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O0

void FTransform_C(uint8_t *src,uint8_t *ref,int16_t *out)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined2 in_DX;
  undefined6 in_register_00000012;
  byte *in_RSI;
  byte *in_RDI;
  int a3_1;
  int a2_1;
  int a1_1;
  int a0_1;
  int a3;
  int a2;
  int a1;
  int a0;
  int d3;
  int d2;
  int d1;
  int d0;
  int tmp [16];
  byte *local_10;
  byte *pbStack_8;
  int i;
  
  tmp._58_6_ = in_register_00000012;
  tmp[0xe]._0_2_ = in_DX;
  local_10 = in_RSI;
  pbStack_8 = in_RDI;
  for (tmp[0xd] = 0; tmp[0xd] < 4; tmp[0xd] = tmp[0xd] + 1) {
    iVar3 = ((uint)*pbStack_8 - (uint)*local_10) + ((uint)pbStack_8[3] - (uint)local_10[3]);
    iVar4 = ((uint)pbStack_8[1] - (uint)local_10[1]) + ((uint)pbStack_8[2] - (uint)local_10[2]);
    iVar5 = ((uint)pbStack_8[1] - (uint)local_10[1]) - ((uint)pbStack_8[2] - (uint)local_10[2]);
    iVar6 = ((uint)*pbStack_8 - (uint)*local_10) - ((uint)pbStack_8[3] - (uint)local_10[3]);
    (&a1)[tmp[0xd] << 2] = (iVar3 + iVar4) * 8;
    (&a1)[tmp[0xd] * 4 + 1] = iVar5 * 0x8a9 + iVar6 * 0x14e8 + 0x714 >> 9;
    (&a1)[tmp[0xd] * 4 + 2] = (iVar3 - iVar4) * 8;
    (&a1)[tmp[0xd] * 4 + 3] = iVar6 * 0x8a9 + iVar5 * -0x14e8 + 0x3a9 >> 9;
    pbStack_8 = pbStack_8 + 0x20;
    local_10 = local_10 + 0x20;
  }
  for (tmp[0xd] = 0; tmp[0xd] < 4; tmp[0xd] = tmp[0xd] + 1) {
    iVar3 = (&a1)[tmp[0xd]];
    iVar4 = (&a1)[tmp[0xd] + 0xc];
    iVar5 = (&a1)[tmp[0xd] + 4];
    iVar6 = (&a1)[tmp[0xd] + 8];
    iVar1 = (&a1)[tmp[0xd] + 4];
    iVar2 = (&a1)[tmp[0xd] + 8];
    iVar7 = (&a1)[tmp[0xd]] - (&a1)[tmp[0xd] + 0xc];
    *(short *)(tmp._56_8_ + (long)tmp[0xd] * 2) = (short)(iVar3 + iVar4 + iVar5 + iVar6 + 7 >> 4);
    *(ushort *)(tmp._56_8_ + (long)(tmp[0xd] + 4) * 2) =
         (short)((uint)((iVar1 - iVar2) * 0x8a9 + iVar7 * 0x14e8 + 12000) >> 0x10) +
         (ushort)(iVar7 != 0);
    *(short *)(tmp._56_8_ + (long)(tmp[0xd] + 8) * 2) =
         (short)(((iVar3 + iVar4) - (iVar5 + iVar6)) + 7 >> 4);
    *(short *)(tmp._56_8_ + (long)(tmp[0xd] + 0xc) * 2) =
         (short)((uint)(iVar7 * 0x8a9 + (iVar1 - iVar2) * -0x14e8 + 51000) >> 0x10);
  }
  return;
}

Assistant:

static void FTransform_C(const uint8_t* src, const uint8_t* ref, int16_t* out) {
  int i;
  int tmp[16];
  for (i = 0; i < 4; ++i, src += BPS, ref += BPS) {
    const int d0 = src[0] - ref[0];   // 9bit dynamic range ([-255,255])
    const int d1 = src[1] - ref[1];
    const int d2 = src[2] - ref[2];
    const int d3 = src[3] - ref[3];
    const int a0 = (d0 + d3);         // 10b                      [-510,510]
    const int a1 = (d1 + d2);
    const int a2 = (d1 - d2);
    const int a3 = (d0 - d3);
    tmp[0 + i * 4] = (a0 + a1) * 8;   // 14b                      [-8160,8160]
    tmp[1 + i * 4] = (a2 * 2217 + a3 * 5352 + 1812) >> 9;      // [-7536,7542]
    tmp[2 + i * 4] = (a0 - a1) * 8;
    tmp[3 + i * 4] = (a3 * 2217 - a2 * 5352 +  937) >> 9;
  }
  for (i = 0; i < 4; ++i) {
    const int a0 = (tmp[0 + i] + tmp[12 + i]);  // 15b
    const int a1 = (tmp[4 + i] + tmp[ 8 + i]);
    const int a2 = (tmp[4 + i] - tmp[ 8 + i]);
    const int a3 = (tmp[0 + i] - tmp[12 + i]);
    out[0 + i] = (a0 + a1 + 7) >> 4;            // 12b
    out[4 + i] = ((a2 * 2217 + a3 * 5352 + 12000) >> 16) + (a3 != 0);
    out[8 + i] = (a0 - a1 + 7) >> 4;
    out[12+ i] = ((a3 * 2217 - a2 * 5352 + 51000) >> 16);
  }
}